

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

StructDef * __thiscall
flatbuffers::Parser::LookupCreateStruct
          (Parser *this,string *name,bool create_if_new,bool definition)

{
  size_type *psVar1;
  SymbolTable<flatbuffers::StructDef> *this_00;
  _Rb_tree_header *p_Var2;
  int *piVar3;
  pointer pcVar4;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr;
  const_iterator cVar5;
  StructDef *this_01;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  undefined8 *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  unique_ptr<std::string> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string qualified_name;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  string local_50;
  
  Namespace::GetFullyQualifiedName(&local_50,this->current_namespace_,name,1000);
  this_00 = &this->structs_;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                  *)this_00,name);
  p_Var2 = &(this->structs_).dict._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node == p_Var2) {
    this_01 = (StructDef *)0x0;
  }
  else {
    this_01 = *(StructDef **)(cVar5._M_node + 2);
  }
  if ((this_01 != (StructDef *)0x0) &&
     (piVar3 = &(this_01->super_Definition).refcount, *piVar3 = *piVar3 + 1,
     this_01->predecl == true)) {
    if (definition) {
      (this_01->super_Definition).defined_namespace = this->current_namespace_;
      SymbolTable<flatbuffers::StructDef>::Move(this_00,name,&local_50);
    }
    goto LAB_0010739a;
  }
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                  *)this_00,&local_50);
  if ((_Rb_tree_header *)cVar5._M_node == p_Var2) {
    this_01 = (StructDef *)0x0;
  }
  else {
    this_01 = *(StructDef **)(cVar5._M_node + 2);
  }
  if ((this_01 != (StructDef *)0x0) &&
     (piVar3 = &(this_01->super_Definition).refcount, *piVar3 = *piVar3 + 1,
     this_01->predecl == true)) {
    if (!definition) goto LAB_0010739a;
LAB_0010721e:
    (this_01->super_Definition).defined_namespace = this->current_namespace_;
    goto LAB_0010739a;
  }
  if (this_01 == (StructDef *)0x0 && !definition) {
    this_01 = LookupStructThruParentNamespaces(this,name);
  }
  if (!create_if_new || this_01 != (StructDef *)0x0) goto LAB_0010739a;
  this_01 = (StructDef *)operator_new(0x148);
  StructDef::StructDef(this_01);
  if (definition) {
    SymbolTable<flatbuffers::StructDef>::Add(this_00,&local_50,this_01);
    std::__cxx11::string::_M_assign((string *)this_01);
    goto LAB_0010721e;
  }
  SymbolTable<flatbuffers::StructDef>::Add(this_00,name,this_01);
  std::__cxx11::string::_M_assign((string *)this_01);
  (this_01->super_Definition).defined_namespace = this->current_namespace_;
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  pcVar4 = (this->file_being_parsed_)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + (this->file_being_parsed_)._M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  NumToString<int>(&local_70,(this->super_ParserState).line_);
  uVar8 = 0xf;
  if (local_90 != local_80) {
    uVar8 = local_80[0];
  }
  if (uVar8 < local_70._M_string_length + local_88) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar9 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_70._M_string_length + local_88) goto LAB_001072e9;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_001072e9:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  }
  (_Var6._M_head_impl)->_M_dataplus = (_Alloc_hider)&(_Var6._M_head_impl)->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar9 = puVar7[3];
    ((_Var6._M_head_impl)->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&(_Var6._M_head_impl)->field_2 + 8) = uVar9;
  }
  else {
    (_Var6._M_head_impl)->_M_dataplus = (_Alloc_hider)*puVar7;
    ((_Var6._M_head_impl)->field_2)._M_allocated_capacity = *psVar1;
  }
  (_Var6._M_head_impl)->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  this_02 = &this_01->original_location;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  __ptr._M_head_impl =
       (this_02->_M_t).
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  (this_02->_M_t).
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = _Var6._M_head_impl;
  if (__ptr._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_02,__ptr._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
LAB_0010739a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return this_01;
}

Assistant:

StructDef *Parser::LookupCreateStruct(const std::string &name,
                                      bool create_if_new, bool definition) {
  std::string qualified_name = current_namespace_->GetFullyQualifiedName(name);
  // See if it exists pre-declared by an unqualified use.
  auto struct_def = LookupStruct(name);
  if (struct_def && struct_def->predecl) {
    if (definition) {
      // Make sure it has the current namespace, and is registered under its
      // qualified name.
      struct_def->defined_namespace = current_namespace_;
      structs_.Move(name, qualified_name);
    }
    return struct_def;
  }
  // See if it exists pre-declared by an qualified use.
  struct_def = LookupStruct(qualified_name);
  if (struct_def && struct_def->predecl) {
    if (definition) {
      // Make sure it has the current namespace.
      struct_def->defined_namespace = current_namespace_;
    }
    return struct_def;
  }
  if (!definition && !struct_def) {
    struct_def = LookupStructThruParentNamespaces(name);
  }
  if (!struct_def && create_if_new) {
    struct_def = new StructDef();
    if (definition) {
      structs_.Add(qualified_name, struct_def);
      struct_def->name = name;
      struct_def->defined_namespace = current_namespace_;
    } else {
      // Not a definition.
      // Rather than failing, we create a "pre declared" StructDef, due to
      // circular references, and check for errors at the end of parsing.
      // It is defined in the current namespace, as the best guess what the
      // final namespace will be.
      structs_.Add(name, struct_def);
      struct_def->name = name;
      struct_def->defined_namespace = current_namespace_;
      struct_def->original_location.reset(
          new std::string(file_being_parsed_ + ":" + NumToString(line_)));
    }
  }
  return struct_def;
}